

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

string * __thiscall
pbrt::HaltonSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,HaltonSampler *this)

{
  int *unaff_RBX;
  
  StringPrintf<pstd::vector<pbrt::DigitPermutation,pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>>*const&,pbrt::HaltonPixelIndexer_const&,pbrt::Point2<int>const&,int_const&,int_const&,int_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ HaltonSampler digitPermutations: %p haltonPixelIndexer: %s pixel: %s sampleIndex: %d dimension: %d samplesPerPixel: %d ]"
             ,(char *)this,
             (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
              **)&this->haltonPixelIndexer,(HaltonPixelIndexer *)&this->pixel,
             (Point2<int> *)&this->sampleIndex,&this->dimension,&this->samplesPerPixel,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string HaltonSampler::ToString() const {
    return StringPrintf("[ HaltonSampler digitPermutations: %p haltonPixelIndexer: %s "
                        "pixel: %s sampleIndex: %d dimension: %d samplesPerPixel: %d ]",
                        digitPermutations, haltonPixelIndexer, pixel, sampleIndex,
                        dimension, samplesPerPixel);
}